

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTest::AssertParse(DyndepParserTest *this,char *input)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_119;
  string err;
  string local_f8;
  DyndepParser parser;
  
  DyndepParser::DyndepParser(&parser,&this->state_,(FileReader *)&this->fs_,&this->dyndep_file_);
  pTVar1 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,input,&local_119);
  bVar2 = DyndepParser::ParseTest(&parser,&local_f8,&err);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x1f,"parser.ParseTest(input, &err)");
  std::__cxx11::string::~string((string *)&local_f8);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&err);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                     ,0x20,"\"\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&err);
  DyndepParser::~DyndepParser(&parser);
  return;
}

Assistant:

void AssertParse(const char* input) {
    DyndepParser parser(&state_, &fs_, &dyndep_file_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
  }